

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesBodySharedMass::ArchiveIN(ChVariablesBodySharedMass *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChSharedMassBody_*> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChVariablesBodySharedMass>(marchive);
  local_28._value = &this->sharedmass;
  local_28._name = "sharedmass";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChVariablesBodySharedMass::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChVariablesBodySharedMass>();
    // deserialize parent class
    ChVariablesBody::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(sharedmass);
}